

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O0

void __thiscall llvm::yaml::Output::newLineCheck(Output *this)

{
  StringRef LHS;
  bool bVar1;
  size_t sVar2;
  reference pIVar3;
  StringRef local_90;
  StringRef local_80;
  uint local_6c;
  byte local_65;
  uint i;
  undefined1 auStack_60 [3];
  bool OutputDash;
  uint Indent;
  size_t local_58;
  StringRef local_50;
  char *local_40;
  size_t local_38;
  StringRef local_30;
  char *local_20;
  size_t local_18;
  Output *local_10;
  Output *this_local;
  
  local_20 = (this->Padding).Data;
  local_18 = (this->Padding).Length;
  local_10 = this;
  StringRef::StringRef(&local_30,"\n");
  LHS.Length = local_18;
  LHS.Data = local_20;
  bVar1 = llvm::operator!=(LHS,local_30);
  if (bVar1) {
    local_40 = (this->Padding).Data;
    local_38 = (this->Padding).Length;
    output(this,this->Padding);
    memset(&local_50,0,0x10);
    StringRef::StringRef(&local_50);
    (this->Padding).Data = local_50.Data;
    (this->Padding).Length = local_50.Length;
    return;
  }
  outputNewLine(this);
  memset(auStack_60,0,0x10);
  StringRef::StringRef((StringRef *)auStack_60);
  (this->Padding).Data = _auStack_60;
  (this->Padding).Length = local_58;
  sVar2 = SmallVectorBase::size((SmallVectorBase *)&this->StateStack);
  if (sVar2 == 0) {
    return;
  }
  sVar2 = SmallVectorBase::size((SmallVectorBase *)&this->StateStack);
  i = (int)sVar2 - 1;
  local_65 = 0;
  pIVar3 = SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>::back
                     ((SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void> *)
                      &this->StateStack);
  if ((*pIVar3 == inSeqFirstElement) ||
     (pIVar3 = SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>::back
                         ((SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void> *)
                          &this->StateStack), *pIVar3 == inSeqOtherElement)) {
    local_65 = 1;
  }
  else {
    sVar2 = SmallVectorBase::size((SmallVectorBase *)&this->StateStack);
    if (1 < sVar2) {
      pIVar3 = SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>::back
                         ((SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void> *)
                          &this->StateStack);
      if (*pIVar3 != inMapFirstKey) {
        pIVar3 = SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>::back
                           ((SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void> *)
                            &this->StateStack);
        bVar1 = inFlowSeqAnyElement(*pIVar3);
        if ((!bVar1) &&
           (pIVar3 = SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>::back
                               ((SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void> *)
                                &this->StateStack), *pIVar3 != inFlowMapFirstKey))
        goto LAB_028b3be8;
      }
      sVar2 = SmallVectorBase::size((SmallVectorBase *)&this->StateStack);
      pIVar3 = SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>::operator[]
                         ((SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void> *)
                          &this->StateStack,sVar2 - 2);
      bVar1 = inSeqAnyElement(*pIVar3);
      if (bVar1) {
        i = i - 1;
        local_65 = 1;
      }
    }
  }
LAB_028b3be8:
  for (local_6c = 0; local_6c < i; local_6c = local_6c + 1) {
    StringRef::StringRef(&local_80,"  ");
    output(this,local_80);
  }
  if ((local_65 & 1) != 0) {
    StringRef::StringRef(&local_90,"- ");
    output(this,local_90);
  }
  return;
}

Assistant:

void Output::newLineCheck() {
  if (Padding != "\n") {
    output(Padding);
    Padding = {};
    return;
  }
  outputNewLine();
  Padding = {};

  if (StateStack.size() == 0)
    return;

  unsigned Indent = StateStack.size() - 1;
  bool OutputDash = false;

  if (StateStack.back() == inSeqFirstElement ||
      StateStack.back() == inSeqOtherElement) {
    OutputDash = true;
  } else if ((StateStack.size() > 1) &&
             ((StateStack.back() == inMapFirstKey) ||
              inFlowSeqAnyElement(StateStack.back()) ||
              (StateStack.back() == inFlowMapFirstKey)) &&
             inSeqAnyElement(StateStack[StateStack.size() - 2])) {
    --Indent;
    OutputDash = true;
  }

  for (unsigned i = 0; i < Indent; ++i) {
    output("  ");
  }
  if (OutputDash) {
    output("- ");
  }

}